

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O3

void __thiscall NaVector::write_file(NaVector *this,NaDataFile *pDF)

{
  int iVar1;
  uint uVar2;
  undefined4 *puVar3;
  uint uVar4;
  
  if (pDF != (NaDataFile *)0x0) {
    iVar1 = (*this->_vptr_NaVector[6])();
    if (iVar1 != 0) {
      uVar4 = 0;
      do {
        (*pDF->_vptr_NaDataFile[6])(pDF);
        (*this->_vptr_NaVector[9])(this,(ulong)uVar4);
        (*pDF->_vptr_NaDataFile[2])(pDF,0);
        uVar4 = uVar4 + 1;
        uVar2 = (*this->_vptr_NaVector[6])(this);
      } while (uVar4 < uVar2);
    }
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaVector::write_file (NaDataFile* pDF) const
{
    if(NULL == pDF)
        throw(na_null_pointer);

    unsigned    i;
    for(i = 0; i < dim(); ++i){
        pDF->AppendRecord();
        pDF->SetValue(get(i));
    }
}